

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Solution.cpp
# Opt level: O3

void __thiscall Solution::mutate_inversion(Solution *this)

{
  Vehicle *pVVar1;
  _List_node_base *p_Var2;
  int pos;
  int iVar3;
  mapped_type *pmVar4;
  _List_node_base *p_Var5;
  difference_type __d;
  ulong uVar6;
  _List_node_base *p_Var7;
  _Self __tmp;
  _List_node_base *p_Var8;
  _Node *__tmp_1;
  long *******ppppppplVar9;
  long *******ppppppplVar10;
  int iVar11;
  ulong uVar12;
  int ec;
  list<std::pair<Point_*,_int>,_std::allocator<std::pair<Point_*,_int>_>_> points_list;
  Solution *local_68;
  Vehicle *local_60;
  long *******local_58;
  long *******local_50;
  long local_48;
  ulong local_40;
  Solution *local_38;
  
  p_Var7 = (this->vehicles).super__List_base<Vehicle_*,_std::allocator<Vehicle_*>_>._M_impl._M_node.
           super__List_node_base._M_next;
  iVar3 = rand();
  uVar6 = (ulong)(long)iVar3 %
          (this->vehicles).super__List_base<Vehicle_*,_std::allocator<Vehicle_*>_>._M_impl._M_node.
          _M_size;
  if ((long)uVar6 < 1) {
    for (; uVar6 != 0; uVar6 = uVar6 + 1) {
      p_Var7 = p_Var7->_M_prev;
    }
  }
  else {
    do {
      p_Var7 = p_Var7->_M_next;
      uVar6 = uVar6 - 1;
    } while (uVar6 != 0);
  }
  pVVar1 = (Vehicle *)p_Var7[1]._M_next;
  if (2 < (pVVar1->nodes).
          super__List_base<std::shared_ptr<VehicleState>,_std::allocator<std::shared_ptr<VehicleState>_>_>
          ._M_impl._M_node._M_size) {
    local_38 = this;
    iVar3 = rand();
    uVar12 = (ulong)(long)iVar3 %
             ((pVVar1->nodes).
              super__List_base<std::shared_ptr<VehicleState>,_std::allocator<std::shared_ptr<VehicleState>_>_>
              ._M_impl._M_node._M_size - 2) + 2;
    iVar3 = rand();
    local_40 = (ulong)(long)iVar3 % uVar12;
    p_Var7 = (pVVar1->nodes).
             super__List_base<std::shared_ptr<VehicleState>,_std::allocator<std::shared_ptr<VehicleState>_>_>
             ._M_impl._M_node.super__List_node_base._M_next;
    uVar6 = local_40;
    p_Var8 = p_Var7;
    if ((long)local_40 < 1) {
      for (; uVar6 != 0; uVar6 = uVar6 + 1) {
        p_Var8 = p_Var8->_M_prev;
      }
    }
    else {
      do {
        p_Var8 = p_Var8->_M_next;
        uVar6 = uVar6 - 1;
      } while (uVar6 != 0);
    }
    if ((long)uVar12 < 1) {
      do {
        p_Var7 = p_Var7->_M_prev;
        uVar12 = uVar12 + 1;
      } while (uVar12 != 0);
    }
    else {
      do {
        p_Var7 = p_Var7->_M_next;
        uVar12 = uVar12 - 1;
      } while (uVar12 != 0);
    }
    local_58 = (long *******)&local_58;
    local_48 = 0;
    if (p_Var8 != p_Var7) {
      ppppppplVar10 = (long *******)&local_58;
      local_60 = pVVar1;
      local_50 = local_58;
      do {
        p_Var8 = p_Var8->_M_next;
        p_Var2 = (p_Var8[1]._M_next)->_M_next;
        local_68 = local_38;
        pmVar4 = std::__detail::
                 _Map_base<Solution_*,_std::pair<Solution_*const,_std::pair<Vehicle_*,_int>_>,_std::allocator<std::pair<Solution_*const,_std::pair<Vehicle_*,_int>_>_>,_std::__detail::_Select1st,_std::equal_to<Solution_*>,_std::hash<Solution_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                 ::operator[]((_Map_base<Solution_*,_std::pair<Solution_*const,_std::pair<Vehicle_*,_int>_>,_std::allocator<std::pair<Solution_*const,_std::pair<Vehicle_*,_int>_>_>,_std::__detail::_Select1st,_std::equal_to<Solution_*>,_std::hash<Solution_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                               *)(p_Var2 + 2),&local_68);
        iVar3 = pmVar4->second;
        p_Var5 = (_List_node_base *)operator_new(0x20);
        p_Var5[1]._M_next = p_Var2;
        *(int *)&p_Var5[1]._M_prev = iVar3;
        std::__detail::_List_node_base::_M_hook(p_Var5);
        pVVar1 = local_60;
        local_48 = local_48 + 1;
      } while (p_Var8 != p_Var7);
      if (local_58 != ppppppplVar10) {
        iVar3 = *(int *)(local_58 + 3);
        ppppppplVar9 = local_58;
        do {
          Vehicle::remove_node(pVVar1,iVar3);
          ppppppplVar9 = (long *******)*ppppppplVar9;
        } while (ppppppplVar9 != ppppppplVar10);
      }
      if (ppppppplVar10 != local_58) {
        iVar11 = 0;
        iVar3 = 2;
LAB_0010623d:
        local_68 = (Solution *)((ulong)local_68 & 0xffffffff00000000);
        pos = (int)local_40;
        Vehicle::add_node(local_60,(Point *)ppppppplVar10[1][2],iVar11 + pos,(int *)&local_68);
        pVVar1 = local_60;
        if ((int)local_68 == 0) goto code_r0x00106268;
        local_68 = (Solution *)((ulong)local_68 & 0xffffffff00000000);
        while (iVar3 = iVar3 + -1, 1 < iVar3) {
          Vehicle::remove_node(pVVar1,pos);
        }
        ppppppplVar10 = (long *******)&local_58;
        while (ppppppplVar10 = (long *******)*ppppppplVar10,
              (long ********)ppppppplVar10 != &local_58) {
          Vehicle::add_node(pVVar1,(Point *)ppppppplVar10[2],*(int *)(ppppppplVar10 + 3),
                            (int *)&local_68);
        }
      }
LAB_001062cd:
      ppppppplVar10 = local_58;
      while ((long ********)ppppppplVar10 != &local_58) {
        ppppppplVar9 = (long *******)*ppppppplVar10;
        operator_delete(ppppppplVar10);
        ppppppplVar10 = ppppppplVar9;
      }
    }
  }
  return;
code_r0x00106268:
  ppppppplVar10 = (long *******)ppppppplVar10[1];
  iVar3 = iVar3 + 1;
  iVar11 = iVar11 + 1;
  if (ppppppplVar10 == local_58) goto LAB_001062cd;
  goto LAB_0010623d;
}

Assistant:

void Solution::mutate_inversion() {
    auto vit = vehicles.begin();
    std::advance(vit, rand() % vehicles.size());
    auto v1 = *vit;

    if (v1->nodes.size() < 3)
        return;
    auto range_max = rand() % (v1->nodes.size() - 2) + 2;
    auto range_min = rand() % range_max;

    auto nit = v1->nodes.begin();
    std::advance(nit, range_min);
    auto nit2 = v1->nodes.begin();
    std::advance(nit2, range_max);

    std::list<std::pair<Point *, int>> points_list;

    while (nit++ != nit2) {
        auto p = (*nit)->p;
        points_list.push_back(std::pair<Point *, int>(p, p->state[this].second));
        //v1->remove_node(p->state[this].second);//invalidate iterators
    }

    int remove_pos = (*points_list.begin()).second;
    for (auto pair: points_list) {
        v1->remove_node(remove_pos);
    }

    auto i = 0;
    for (auto rit = points_list.rbegin(); rit != points_list.rend(); ++rit) {
        auto p = (*rit).first;
        auto ec = 0;
        v1->add_node(p, range_min + i++, ec);
        if (ec != 0) {//Error, repair route
            ec = 0;
            while (--i > 0) {
                v1->remove_node(range_min);
            }
            for (auto pair: points_list) {
                v1->add_node(pair.first, pair.second, ec);
            }
            break;
        }
    }


}